

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  int szPromote_00;
  int iVar1;
  Fts5Index *p_00;
  long lVar2;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  int sz;
  Fts5StructureLevel *pTst;
  int szMax;
  int i;
  int nSeg;
  int szSeg;
  Fts5StructureSegment *pSeg;
  int szPromote;
  int iPromote;
  int iTst;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_1c;
  
  if ((*(int *)(in_RDI + 0x3c) == 0) &&
     (szPromote_00 = *(int *)(in_RDX + (long)in_ESI * 0x10 + 0x24), szPromote_00 != 0)) {
    p_00 = (Fts5Index *)
           (*(long *)(in_RDX + (long)in_ESI * 0x10 + 0x28) +
           (long)(*(int *)(in_RDX + (long)in_ESI * 0x10 + 0x24) + -1) * 0x38);
    local_1c = in_ESI + -1;
    while( true ) {
      bVar3 = false;
      if (-1 < local_1c) {
        bVar3 = *(int *)(in_RDX + (long)local_1c * 0x10 + 0x24) == 0;
      }
      if (!bVar3) break;
      local_1c = local_1c + -1;
    }
    if (-1 < local_1c) {
      in_stack_ffffffffffffffc0 = 0;
      lVar2 = in_RDX + 0x20 + (long)local_1c * 0x10;
      for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < *(int *)(lVar2 + 4);
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
        iVar1 = (*(int *)(*(long *)(lVar2 + 8) + (long)in_stack_ffffffffffffffc4 * 0x38 + 8) -
                *(int *)(*(long *)(lVar2 + 8) + (long)in_stack_ffffffffffffffc4 * 0x38 + 4)) + 1;
        if (in_stack_ffffffffffffffc0 < iVar1) {
          in_stack_ffffffffffffffc0 = iVar1;
        }
      }
    }
    fts5StructurePromoteTo
              (p_00,(*(int *)&p_00->zDataTbl + 1) - *(int *)((long)&p_00->pConfig + 4),szPromote_00,
               (Fts5Structure *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}